

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O0

int __thiscall CVmObjCharSet::equals(CVmObjCharSet *this,vm_obj_id_t self,vm_val_t *val,int param_4)

{
  CVmObject *this_00;
  vmobj_charset_ext_t *pvVar1;
  vmobj_charset_ext_t *pvVar2;
  int *in_RDX;
  int in_ESI;
  CVmObjCharSet *in_RDI;
  void *unaff_retaddr;
  vmobj_charset_ext_t *other_ext;
  vmobj_charset_ext_t *ext;
  CVmObjCharSet *other;
  bool local_49;
  CVmObjCharSet *len;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if ((*in_RDX == 5) && (in_RDX[2] == in_ESI)) {
    iVar3 = 1;
  }
  else {
    if ((*in_RDX == 5) && (len = in_RDI, iVar3 = is_charset(0), iVar3 != 0)) {
      this_00 = vm_objp(0);
      pvVar1 = get_ext_ptr(in_RDI);
      pvVar2 = get_ext_ptr((CVmObjCharSet *)this_00);
      local_49 = false;
      if (pvVar1->charset_name_len == pvVar2->charset_name_len) {
        iVar3 = memicmp(unaff_retaddr,
                        (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (size_t)len);
        local_49 = iVar3 == 0;
      }
      return (uint)local_49;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int CVmObjCharSet::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                          int /*depth*/) const
{
    CVmObjCharSet *other;
    const vmobj_charset_ext_t *ext;
    const vmobj_charset_ext_t *other_ext;

    /* if it's a self-reference, it's certainly equal */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* if it's not another character set, it's not equal */
    if (val->typ != VM_OBJ || !is_charset(vmg_ val->val.obj))
        return FALSE;

    /* we know it's another character set - cast it */
    other = (CVmObjCharSet *)vm_objp(vmg_ val->val.obj);

    /* get my extension and the other extension */
    ext = get_ext_ptr();
    other_ext = other->get_ext_ptr();

    /* it's equal if it has the same name (ignoring case) */
    return (ext->charset_name_len == other_ext->charset_name_len
            && memicmp(ext->charset_name, other_ext->charset_name,
                       ext->charset_name_len) == 0);
}